

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_start(bitstream *str,uint32_t *val)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int iVar3;
  void *pvVar4;
  uint32_t local_2c;
  int local_28;
  uint32_t bit;
  int nsbit;
  int nzbit;
  uint32_t *val_local;
  bitstream *str_local;
  
  _nsbit = val;
  val_local = &str->dir;
  if ((str->type == VS_H261) || (str->type == VS_H263)) {
    bit = 0x10;
    if (str->type == VS_H261) {
      bit = 0xf;
    }
    local_28 = 5;
    if (str->type == VS_H261) {
      local_28 = 4;
    }
    local_2c = 0;
    while( true ) {
      if ((int)bit <= (int)val_local[10]) {
        do {
          if (local_2c != 0) {
            iVar3 = vs_u((bitstream *)val_local,_nsbit,local_28);
            if (iVar3 != 0) {
              return 1;
            }
            return 0;
          }
          local_2c = 1;
          iVar3 = vs_bit((bitstream *)val_local,&local_2c);
        } while (iVar3 == 0);
        return 1;
      }
      iVar3 = vs_bit((bitstream *)val_local,&local_2c);
      if (iVar3 != 0) break;
      if (local_2c != 0) {
        fprintf(_stderr,"Found premature 1 bit when searching for a start code!\n");
        return 1;
      }
    }
    return 1;
  }
  if (str->bitpos != 7) {
    fprintf(_stderr,"Start code attempted at non-bytealigned position\n");
    return 1;
  }
  if (str->dir == VS_ENCODE) {
    if (str->bytesmax <= str->bytesnum) {
      if (str->bytesmax == 0) {
        str->bytesmax = 0x10;
      }
      else {
        str->bytesmax = str->bytesmax << 1;
      }
      pvVar4 = realloc(str->bytes,(long)str->bytesmax);
      *(void **)(val_local + 2) = pvVar4;
    }
    uVar1 = val_local[4];
    val_local[4] = uVar1 + 1;
    *(undefined1 *)(*(long *)(val_local + 2) + (long)(int)uVar1) = 0;
    if ((int)val_local[5] <= (int)val_local[4]) {
      if (val_local[5] == 0) {
        val_local[5] = 0x10;
      }
      else {
        val_local[5] = val_local[5] << 1;
      }
      pvVar4 = realloc(*(void **)(val_local + 2),(long)(int)val_local[5]);
      *(void **)(val_local + 2) = pvVar4;
    }
    uVar1 = val_local[4];
    val_local[4] = uVar1 + 1;
    *(undefined1 *)(*(long *)(val_local + 2) + (long)(int)uVar1) = 0;
    if ((int)val_local[5] <= (int)val_local[4]) {
      if (val_local[5] == 0) {
        val_local[5] = 0x10;
      }
      else {
        val_local[5] = val_local[5] << 1;
      }
      pvVar4 = realloc(*(void **)(val_local + 2),(long)(int)val_local[5]);
      *(void **)(val_local + 2) = pvVar4;
    }
    uVar1 = val_local[4];
    val_local[4] = uVar1 + 1;
    *(undefined1 *)(*(long *)(val_local + 2) + (long)(int)uVar1) = 1;
    if ((int)val_local[5] <= (int)val_local[4]) {
      if (val_local[5] == 0) {
        val_local[5] = 0x10;
      }
      else {
        val_local[5] = val_local[5] << 1;
      }
      pvVar4 = realloc(*(void **)(val_local + 2),(long)(int)val_local[5]);
      *(void **)(val_local + 2) = pvVar4;
    }
    uVar1 = *_nsbit;
    uVar2 = val_local[4];
    val_local[4] = uVar2 + 1;
    *(char *)(*(long *)(val_local + 2) + (long)(int)uVar2) = (char)uVar1;
  }
  else {
    str->zero_bytes = str->zero_bytes + -1;
    do {
      str->zero_bytes = str->zero_bytes + 1;
      if (str->bytesnum <= str->bytepos) {
        fprintf(_stderr,"End of bitstream when searching for a start code!\n");
        return 1;
      }
      iVar3 = str->bytepos;
      str->bytepos = iVar3 + 1;
      str->curbyte = str->bytes[iVar3];
    } while (str->curbyte == '\0');
    if (str->curbyte != '\x01') {
      fprintf(_stderr,"Found byte %08x when searching for a start code!\n",(ulong)str->curbyte);
      return 1;
    }
    if (str->zero_bytes < 2) {
      fprintf(_stderr,"Found premature byte %08x when searching for a start code!\n",
              (ulong)str->curbyte);
      return 1;
    }
    if (str->bytesnum <= str->bytepos) {
      fprintf(_stderr,"End of bitstream when searching for a start code!\n");
      return 1;
    }
    iVar3 = str->bytepos;
    str->bytepos = iVar3 + 1;
    str->curbyte = str->bytes[iVar3];
    str->zero_bytes = 0;
    *val = (uint)str->curbyte;
  }
  return 0;
}

Assistant:

int vs_start(struct bitstream *str, uint32_t *val) {
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		int nsbit = (str->type == VS_H261 ? 4 : 5);
		uint32_t bit = 0;
		while (str->zero_bits < nzbit) {
			if (vs_bit(str, &bit)) return 1;
			if (bit != 0) {
				fprintf(stderr, "Found premature 1 bit when searching for a start code!\n");
				return 1;
			}
		}
		while (bit == 0) {
			bit = 1;
			if (vs_bit(str, &bit)) return 1;
		}
		if (vs_u(str, val, nsbit)) return 1;
		return 0;
	} else {
		if (str->bitpos != 7) {
			fprintf (stderr, "Start code attempted at non-bytealigned position\n");
			return 1;
		}
		if (str->dir == VS_ENCODE) {
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 1);
			ADDARRAY(str->bytes, *val);
		} else {
			str->zero_bytes--;
			do {
				str->zero_bytes++;
				if (str->bytepos >= str->bytesnum) {
					fprintf(stderr, "End of bitstream when searching for a start code!\n");
					return 1;
				}
				str->curbyte = str->bytes[str->bytepos++];
			} while (str->curbyte == 0);
			if (str->curbyte != 1) {
				fprintf(stderr, "Found byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->zero_bytes < 2) {
				fprintf(stderr, "Found premature byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->bytepos >= str->bytesnum) {
				fprintf(stderr, "End of bitstream when searching for a start code!\n");
				return 1;
			}
			str->curbyte = str->bytes[str->bytepos++];
			str->zero_bytes = 0;
			*val = str->curbyte;
		}
	}
	return 0;
}